

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O1

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitExpr
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,InsideExpression *expr)

{
  size_t sVar1;
  pointer ppEVar2;
  Expression *this_00;
  long lVar3;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  _Stack_48;
  
  FlowAnalysisBase::tryEvalBool
            ((ConstantValue *)&_Stack_48,&this->super_FlowAnalysisBase,&expr->super_Expression);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&_Stack_48);
  ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
            (expr->left_,expr->left_,(TestAnalysis *)this);
  sVar1 = (expr->rangeList_)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (expr->rangeList_)._M_ptr;
    lVar3 = 0;
    do {
      this_00 = *(Expression **)((long)ppEVar2 + lVar3);
      ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
                (this_00,this_00,(TestAnalysis *)this);
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  return;
}

Assistant:

void visitExpr(const InsideExpression& expr) {
        tryEvalBool(expr);
        visit(expr.left());
        for (auto range : expr.rangeList())
            visit(*range);
    }